

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.h
# Opt level: O3

vec4f * __thiscall
GouraudShader::vertex
          (vec4f *__return_storage_ptr__,GouraudShader *this,Model *model,int iface,int nthvert)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 *puVar3;
  long lVar4;
  size_t i;
  double *pdVar5;
  size_t nthvert_00;
  bool bVar6;
  double ret_2;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  vec4f gl_Vertex;
  vec<4UL,_double> ret_1;
  vec<4UL,_double> ret_3;
  double local_108 [4];
  vec<3UL,_double> local_e8;
  undefined8 uStack_d0;
  vec4f *local_c8;
  Model *local_c0;
  undefined1 local_b8 [24];
  double dStack_a0;
  undefined1 local_40 [16];
  
  nthvert_00 = (size_t)nthvert;
  local_c8 = __return_storage_ptr__;
  local_c0 = model;
  Model::vert((vec3f *)local_b8,model,(long)iface,nthvert_00);
  local_108[2] = 0.0;
  local_108[3] = 0.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  i = 3;
  do {
    dVar7 = 1.0;
    if (i + 1 < 4) {
      dVar7 = vec<3UL,_double>::operator[]((vec3f *)local_b8,i);
    }
    local_108[i] = dVar7;
    bVar6 = i != 0;
    i = i - 1;
  } while (bVar6);
  operator*((mat<4UL,_4UL> *)local_b8,&(this->super_IShader).uniform_Projection,
            &(this->super_IShader).uniform_ModelView);
  local_e8.z = 0.0;
  uStack_d0 = 0;
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  lVar2 = 4;
  puVar3 = local_40;
  do {
    lVar2 = lVar2 + -1;
    dVar7 = 0.0;
    lVar4 = 0;
    do {
      dVar7 = dVar7 + *(double *)(puVar3 + lVar4 * 8) * local_108[lVar4 + 3];
      lVar4 = lVar4 + -1;
    } while (lVar4 != -4);
    *(double *)((long)&local_e8 + lVar2 * 8) = dVar7;
    puVar3 = puVar3 + -0x20;
  } while (lVar2 != 0);
  local_108[2] = local_e8.z;
  local_108[3] = (double)uStack_d0;
  local_108[0] = local_e8.x;
  local_108[1] = local_e8.y;
  dStack_a0 = (double)uStack_d0;
  local_b8._16_8_ = local_e8.z;
  local_b8._8_8_ = local_e8.y;
  local_b8._0_8_ = local_e8.x;
  auVar8._8_8_ = uStack_d0;
  auVar8._0_8_ = uStack_d0;
  register0x00001200 = divpd(stack0xffffffffffffff58,auVar8);
  local_b8._0_16_ = divpd(local_b8._0_16_,auVar8);
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  local_e8.z = 0.0;
  lVar2 = 3;
  do {
    lVar4 = (ulong)(lVar2 != 2) * 8 + 8;
    if (lVar2 == 1) {
      lVar4 = 0;
    }
    *(undefined8 *)((long)&local_e8.x + lVar4) = *(undefined8 *)(local_b8 + lVar2 * 8 + -8);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  mat<3UL,_3UL>::set_col(&this->varying_tri,nthvert_00,&local_e8);
  Model::normal((vec3f *)local_b8,local_c0,(long)iface,nthvert_00);
  dVar7 = dot<3ul,double>((vec3f *)local_b8,&this->uniform_light_dir);
  if ((uint)nthvert < 3) {
    dVar9 = 0.0;
    if (0.0 <= dVar7) {
      dVar9 = dVar7;
    }
    dVar7 = 1.0;
    if (dVar9 <= 1.0) {
      dVar7 = dVar9;
    }
    lVar2 = 0;
    if (nthvert != 0) {
      lVar2 = (ulong)(nthvert != 1) * 8 + 8;
    }
    *(double *)((long)&(&this->varying_tri)[1].rows[0].x + lVar2) = dVar7;
    stack0xffffffffffffff58 = ZEXT816(0);
    local_b8._0_16_ = ZEXT816(0);
    pdVar5 = (this->super_IShader).uniform_Viewport.rows[3].data + 3;
    lVar2 = 4;
    do {
      lVar2 = lVar2 + -1;
      lVar4 = 0;
      dVar7 = 0.0;
      do {
        dVar7 = dVar7 + pdVar5[lVar4] * local_108[lVar4 + 3];
        lVar4 = lVar4 + -1;
      } while (lVar4 != -4);
      *(double *)(local_b8 + lVar2 * 8) = dVar7;
      pdVar5 = pdVar5 + -4;
    } while (lVar2 != 0);
    auVar10._8_8_ = dStack_a0;
    auVar10._0_8_ = dStack_a0;
    auVar8 = divpd(stack0xffffffffffffff58,auVar10);
    auVar1._8_8_ = dStack_a0;
    auVar1._0_8_ = dStack_a0;
    auVar10 = divpd(local_b8._0_16_,auVar1);
    *(undefined1 (*) [16])local_c8->data = auVar10;
    *(undefined1 (*) [16])(local_c8->data + 2) = auVar8;
    return local_c8;
  }
  __assert_fail("i >= 0 && i < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0x8c,"T &vec<3>::operator[](const size_t) [n = 3, T = double]");
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        vec4f gl_Vertex = embed<4>(model.vert(iface, nthvert));
        gl_Vertex = uniform_Projection * uniform_ModelView * gl_Vertex;
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));

        varying_ity[nthvert] = clamp(dot(model.normal(iface, nthvert), uniform_light_dir), 0., 1.);

        gl_Vertex = uniform_Viewport * gl_Vertex;
        return proj<4>(gl_Vertex / gl_Vertex[3]);
    }